

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_create_table.cpp
# Opt level: O3

string * __thiscall
duckdb::Transformer::TransformCollation_abi_cxx11_
          (string *__return_storage_ptr__,Transformer *this,
          optional_ptr<duckdb_libpgquery::PGCollateClause,_true> collate)

{
  ParserException *this_00;
  PGListCell *pPVar1;
  optional_ptr<duckdb_libpgquery::PGValue,_true> pgvalue;
  string collation_argument;
  optional_ptr<duckdb_libpgquery::PGValue,_true> local_88;
  optional_ptr<duckdb_libpgquery::PGCollateClause,_true> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (collate.ptr != (PGCollateClause *)0x0) {
    local_80.ptr = collate.ptr;
    optional_ptr<duckdb_libpgquery::PGCollateClause,_true>::CheckValid(&local_80);
    pPVar1 = (local_80.ptr)->collname->head;
    if (pPVar1 != (PGListCell *)0x0) {
      do {
        local_88.ptr = (PGValue *)(pPVar1->data).ptr_value;
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_88);
        if ((local_88.ptr)->type != T_PGString) {
          this_00 = (ParserException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"Expected a string as collation type!","");
          ParserException::ParserException(this_00,&local_78);
          __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
        }
        optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid(&local_88);
        ::std::__cxx11::string::string
                  ((string *)&local_78,((local_88.ptr)->val).str,(allocator *)&local_50);
        if (__return_storage_ptr__->_M_string_length == 0) {
          ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        else {
          ::std::operator+(&local_50,".",&local_78);
          ::std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
        pPVar1 = pPVar1->next;
      } while (pPVar1 != (PGListCell *)0x0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string Transformer::TransformCollation(optional_ptr<duckdb_libpgquery::PGCollateClause> collate) {
	if (!collate) {
		return string();
	}
	string collation;
	for (auto c = collate->collname->head; c != nullptr; c = lnext(c)) {
		auto pgvalue = PGPointerCast<duckdb_libpgquery::PGValue>(c->data.ptr_value);
		if (pgvalue->type != duckdb_libpgquery::T_PGString) {
			throw ParserException("Expected a string as collation type!");
		}
		auto collation_argument = string(pgvalue->val.str);
		if (collation.empty()) {
			collation = collation_argument;
		} else {
			collation += "." + collation_argument;
		}
	}
	return collation;
}